

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O1

void mct_decode_real(float *c0,float *c1,float *c2,int n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  ulong uVar14;
  
  iVar13 = n >> 3;
  if (0 < iVar13) {
    do {
      fVar1 = *c0;
      fVar2 = c0[1];
      fVar3 = c0[2];
      fVar4 = c0[3];
      fVar5 = *c1;
      fVar6 = c1[1];
      fVar7 = c1[2];
      fVar8 = c1[3];
      fVar9 = *c2;
      fVar10 = c2[1];
      fVar11 = c2[2];
      fVar12 = c2[3];
      *c0 = fVar9 * 1.402 + fVar1;
      c0[1] = fVar10 * 1.402 + fVar2;
      c0[2] = fVar11 * 1.402 + fVar3;
      c0[3] = fVar12 * 1.402 + fVar4;
      *c1 = fVar5 * -0.34413 + fVar1 + fVar9 * -0.71414;
      c1[1] = fVar6 * -0.34413 + fVar2 + fVar10 * -0.71414;
      c1[2] = fVar7 * -0.34413 + fVar3 + fVar11 * -0.71414;
      c1[3] = fVar8 * -0.34413 + fVar4 + fVar12 * -0.71414;
      *c2 = fVar5 * 1.772 + fVar1;
      c2[1] = fVar6 * 1.772 + fVar2;
      c2[2] = fVar7 * 1.772 + fVar3;
      c2[3] = fVar8 * 1.772 + fVar4;
      fVar1 = c0[4];
      fVar2 = c0[5];
      fVar3 = c0[6];
      fVar4 = c0[7];
      fVar5 = c1[4];
      fVar6 = c1[5];
      fVar7 = c1[6];
      fVar8 = c1[7];
      fVar9 = c2[4];
      fVar10 = c2[5];
      fVar11 = c2[6];
      fVar12 = c2[7];
      c0[4] = fVar9 * 1.402 + fVar1;
      c0[5] = fVar10 * 1.402 + fVar2;
      c0[6] = fVar11 * 1.402 + fVar3;
      c0[7] = fVar12 * 1.402 + fVar4;
      c1[4] = fVar5 * -0.34413 + fVar1 + fVar9 * -0.71414;
      c1[5] = fVar6 * -0.34413 + fVar2 + fVar10 * -0.71414;
      c1[6] = fVar7 * -0.34413 + fVar3 + fVar11 * -0.71414;
      c1[7] = fVar8 * -0.34413 + fVar4 + fVar12 * -0.71414;
      c2[4] = fVar5 * 1.772 + fVar1;
      c2[5] = fVar6 * 1.772 + fVar2;
      c2[6] = fVar7 * 1.772 + fVar3;
      c2[7] = fVar8 * 1.772 + fVar4;
      c0 = c0 + 8;
      c1 = c1 + 8;
      c2 = c2 + 8;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  if ((n & 7U) != 0) {
    uVar14 = 0;
    do {
      fVar1 = c0[uVar14];
      fVar2 = c1[uVar14];
      fVar3 = c2[uVar14];
      c0[uVar14] = fVar3 * 1.402 + fVar1;
      c1[uVar14] = fVar2 * -0.34413 + fVar1 + fVar3 * -0.71414;
      c2[uVar14] = fVar2 * 1.772 + fVar1;
      uVar14 = uVar14 + 1;
    } while ((n & 7U) != uVar14);
  }
  return;
}

Assistant:

void mct_decode_real(
		float* restrict c0,
		float* restrict c1,
		float* restrict c2,
		int n)
{
	int i;
#ifdef __SSE__
	__m128 vrv, vgu, vgv, vbu;
	vrv = _mm_set1_ps(1.402f);
	vgu = _mm_set1_ps(0.34413f);
	vgv = _mm_set1_ps(0.71414f);
	vbu = _mm_set1_ps(1.772f);
	for (i = 0; i < (n >> 3); ++i) {
		__m128 vy, vu, vv;
		__m128 vr, vg, vb;

		vy = _mm_load_ps(c0);
		vu = _mm_load_ps(c1);
		vv = _mm_load_ps(c2);
		vr = _mm_add_ps(vy, _mm_mul_ps(vv, vrv));
		vg = _mm_sub_ps(_mm_sub_ps(vy, _mm_mul_ps(vu, vgu)), _mm_mul_ps(vv, vgv));
		vb = _mm_add_ps(vy, _mm_mul_ps(vu, vbu));
		_mm_store_ps(c0, vr);
		_mm_store_ps(c1, vg);
		_mm_store_ps(c2, vb);
		c0 += 4;
		c1 += 4;
		c2 += 4;

		vy = _mm_load_ps(c0);
		vu = _mm_load_ps(c1);
		vv = _mm_load_ps(c2);
		vr = _mm_add_ps(vy, _mm_mul_ps(vv, vrv));
		vg = _mm_sub_ps(_mm_sub_ps(vy, _mm_mul_ps(vu, vgu)), _mm_mul_ps(vv, vgv));
		vb = _mm_add_ps(vy, _mm_mul_ps(vu, vbu));
		_mm_store_ps(c0, vr);
		_mm_store_ps(c1, vg);
		_mm_store_ps(c2, vb);
		c0 += 4;
		c1 += 4;
		c2 += 4;
	}
	n &= 7;
#endif
	for(i = 0; i < n; ++i) {
		float y = c0[i];
		float u = c1[i];
		float v = c2[i];
		float r = y + (v * 1.402f);
		float g = y - (u * 0.34413f) - (v * (0.71414f));
		float b = y + (u * 1.772f);
		c0[i] = r;
		c1[i] = g;
		c2[i] = b;
	}
}